

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O2

EStatusCode __thiscall
PDFDocumentHandler::OnResourcesWrite
          (PDFDocumentHandler *this,ResourcesDictionary *inResources,
          DictionaryContext *inPageResourcesDictionaryContext,
          ObjectsContext *inPDFWriterObjectContext,DocumentContext *inPDFWriterDocumentContext)

{
  bool bVar1;
  EStatusCode EVar2;
  PDFObject *inOriginal;
  string *inKey;
  PDFObjectCastPtr<PDFDictionary> resources;
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  it;
  ObjectIDTypeList dummyObjectList;
  OutWritingPolicy writingPolicy;
  
  inOriginal = FindPageResources(this,this->mParser,this->mWrittenPage);
  resources.super_RefCountPtr<PDFDictionary>.mValue = PDFObjectCast<PDFDictionary>(inOriginal);
  resources.super_RefCountPtr<PDFDictionary>._vptr_RefCountPtr =
       (_func_int **)&PTR__RefCountPtr_0036d8c0;
  dummyObjectList.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
  _M_size = 0;
  dummyObjectList.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&dummyObjectList;
  dummyObjectList.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&dummyObjectList;
  if (resources.super_RefCountPtr<PDFDictionary>.mValue == (PDFDictionary *)0x0) {
    EVar2 = eSuccess;
  }
  else {
    PDFDictionary::GetIterator(&it,resources.super_RefCountPtr<PDFDictionary>.mValue);
    writingPolicy.super_IObjectWritePolicy._vptr_IObjectWritePolicy =
         (_func_int **)&PTR_WriteReference_003700f0;
    EVar2 = eSuccess;
    writingPolicy.mDocumentHandler = this;
    writingPolicy.mSourceObjectsToAdd = &dummyObjectList;
    while( true ) {
      bVar1 = ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
              ::MoveNext(&it.
                          super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                        );
      if ((!bVar1) || (EVar2 != eSuccess)) break;
      inKey = PDFName::GetValue_abi_cxx11_
                        (*(PDFName **)
                          (it.
                           super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                           .mCurrentPosition._M_node + 1));
      EVar2 = DictionaryContext::WriteKey(inPageResourcesDictionaryContext,inKey);
      if (EVar2 == eSuccess) {
        EVar2 = WriteObjectByType(this,(PDFObject *)
                                       it.
                                       super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                       .mCurrentPosition._M_node[1]._M_parent,eTokenSeparatorEndLine
                                  ,&writingPolicy.super_IObjectWritePolicy);
      }
    }
  }
  std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear
            (&dummyObjectList.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>);
  RefCountPtr<PDFDictionary>::~RefCountPtr(&resources.super_RefCountPtr<PDFDictionary>);
  return EVar2;
}

Assistant:

EStatusCode PDFDocumentHandler::OnResourcesWrite(
						ResourcesDictionary* inResources,
						DictionaryContext* inPageResourcesDictionaryContext,
						ObjectsContext* inPDFWriterObjectContext,
						DocumentContext* inPDFWriterDocumentContext)
{
	// Writing resources dictionary. simply loop internal elements and copy. nicely enough, i can use read methods, trusting
	// that no new objects need be written
	
	PDFObjectCastPtr<PDFDictionary> resources(FindPageResources(mParser, mWrittenPage));
	ObjectIDTypeList dummyObjectList; // this one should remain empty...

	// k. no resources...as wierd as that might be...or just wrong...i'll let it be
	if(!resources)
		return PDFHummus::eSuccess;

	MapIterator<PDFNameToPDFObjectMap> it(resources->GetIterator());
	EStatusCode status = PDFHummus::eSuccess;
	OutWritingPolicy writingPolicy(this, dummyObjectList);

	while(it.MoveNext() && PDFHummus::eSuccess == status)
	{
		status = inPageResourcesDictionaryContext->WriteKey(it.GetKey()->GetValue());
		if(PDFHummus::eSuccess == status)
			status = WriteObjectByType(it.GetValue(),eTokenSeparatorEndLine, &writingPolicy);
	}
	return status;
}